

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O1

void __thiscall
acto::core::runtime_t::handle_message
          (runtime_t *this,object_t *obj,
          unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *msg)

{
  actor *this_00;
  int iVar1;
  long in_FS_OFFSET;
  active_actor_guard guard;
  _Head_base<0UL,_acto::core::msg_t_*,_false> local_20;
  active_actor_guard local_18;
  
  if (obj->impl == (actor *)0x0) {
    __assert_fail("obj->impl",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/artpaul[P]acto/src/runtime.cpp"
                  ,0xbb,
                  "virtual void acto::core::runtime_t::handle_message(object_t *, std::unique_ptr<msg_t>)"
                 );
  }
  anon_unknown_0::active_actor_guard::active_actor_guard(&local_18,obj);
  this_00 = obj->impl;
  local_20._M_head_impl =
       (msg->_M_t).super___uniq_ptr_impl<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>
       ._M_t.super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>.
       super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl;
  (msg->_M_t).super___uniq_ptr_impl<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>._M_t
  .super__Tuple_impl<0UL,_acto::core::msg_t_*,_std::default_delete<acto::core::msg_t>_>.
  super__Head_base<0UL,_acto::core::msg_t_*,_false>._M_head_impl = (msg_t *)0x0;
  actor::consume_package
            (this_00,(unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *)
                     &local_20);
  if (local_20._M_head_impl != (msg_t *)0x0) {
    (*(local_20._M_head_impl)->_vptr_msg_t[1])();
  }
  local_20._M_head_impl = (msg_t *)0x0;
  if (*(char *)(in_FS_OFFSET + -8) == '\0') {
    *(undefined1 *)(in_FS_OFFSET + -8) = 1;
    __cxx_global_var_init();
  }
  *(object_t **)(in_FS_OFFSET + -0x50) = local_18.saved_value_;
  if (obj->impl->terminating_ == true) {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)&obj->cs);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
    obj->field_0x60 = obj->field_0x60 | 4;
    pthread_mutex_unlock((pthread_mutex_t *)&obj->cs);
  }
  return;
}

Assistant:

void runtime_t::handle_message(object_t* obj, std::unique_ptr<msg_t> msg) {
  assert(obj->impl);

  {
    active_actor_guard guard(obj);

    obj->impl->consume_package(std::move(msg));
  }

  if (obj->impl->terminating_) {
    std::lock_guard<std::mutex> g(obj->cs);
    obj->deleting = true;
  }
}